

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v3
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v3,
          TPZFMatrix<std::complex<float>_> *r,TPZFMatrix<std::complex<float>_> *v1Plusv2)

{
  _ComplexT _Var1;
  int64_t iVar2;
  complex<float> *pcVar3;
  complex<float> *pcVar4;
  TPZMatrix<std::complex<float>_> *pTVar5;
  pair<int,_int> *ppVar6;
  long col;
  long *in_RDX;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  pair<int,_int> ind_1;
  pair<int,_int> ind;
  int neqs;
  int i;
  TPZFNMatrix<100,_std::complex<float>_> inv_sys;
  TPZFNMatrix<100,_std::complex<float>_> vec_t3;
  TPZFNMatrix<100,_std::complex<float>_> vec_t2;
  TPZFNMatrix<100,_std::complex<float>_> vec_t;
  complex<float> *in_stack_ffffffffffffefa8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffefb0;
  int64_t in_stack_ffffffffffffefc0;
  int64_t in_stack_ffffffffffffefc8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffefd0;
  complex<float> *in_stack_ffffffffffffefe8;
  int64_t in_stack_ffffffffffffeff0;
  int64_t in_stack_ffffffffffffeff8;
  TPZFNMatrix<100,_std::complex<float>_> *in_stack_fffffffffffff000;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff008;
  int iStack_f44;
  int local_f34;
  complex<float> local_f30 [49];
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff258;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff260;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff268;
  TPZStepSolver<std::complex<float>_> *in_stack_fffffffffffff270;
  complex<float> local_b70 [122];
  complex<float> local_7a0;
  undefined1 local_798 [952];
  complex<float> local_3e0;
  undefined1 local_3d8 [960];
  long *local_18;
  
  local_18 = in_RDX;
  std::complex<float>::complex(&local_3e0,0.0,0.0);
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8);
  std::complex<float>::complex(&local_7a0,0.0,0.0);
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8);
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x8f8));
  std::complex<float>::complex(local_b70,0.0,0.0);
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8);
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x8f8));
  std::complex<float>::complex(local_f30,0.0,0.0);
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
             in_stack_ffffffffffffefe8);
  iVar2 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8));
  for (local_f34 = 0; local_f34 < (int)iVar2; local_f34 = local_f34 + 1) {
    TPZVec<std::pair<int,_int>_>::operator[]
              ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_f34);
    pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                        in_stack_ffffffffffffefc0);
    pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                        in_stack_ffffffffffffefc0);
    pcVar4->_M_value = pcVar3->_M_value;
  }
  pTVar5 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)(in_RDI + 0x520));
  (*(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar5,local_3d8,local_798,0);
  for (local_f34 = 0; local_f34 < (int)iVar2; local_f34 = local_f34 + 1) {
    ppVar6 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_f34);
    iStack_f44 = (*ppVar6).second;
    _Var1 = (**(code **)(*local_18 + 0x120))(local_18,(long)iStack_f44,0);
    pcVar3 = TPZFMatrix<std::complex<float>_>::operator()
                       (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                        in_stack_ffffffffffffefc0);
    pcVar3->_M_value = _Var1;
  }
  local_f34 = 0;
  while( true ) {
    iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x8f8));
    if (iVar2 <= local_f34) break;
    in_stack_fffffffffffff008 =
         (TPZFMatrix<std::complex<float>_> *)
         TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8f8),(long)local_f34);
    in_stack_fffffffffffff000 =
         (TPZFNMatrix<100,_std::complex<float>_> *)
         TPZFMatrix<std::complex<float>_>::operator()
                   (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8f8),(long)local_f34);
    TPZFMatrix<std::complex<float>_>::operator()
              (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
    std::operator-(in_stack_ffffffffffffefa8,(complex<float> *)0x1ffd002);
    in_stack_ffffffffffffefd0 =
         (TPZFMatrix<std::complex<float>_> *)
         TPZFMatrix<std::complex<float>_>::operator()
                   (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
    (in_stack_ffffffffffffefd0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_f34 = local_f34 + 1;
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268,in_stack_fffffffffffff260,
             in_stack_fffffffffffff258);
  TPZFMatrix<std::complex<float>_>::Zero(in_stack_ffffffffffffefb0);
  local_f34 = 0;
  while( true ) {
    col = (long)local_f34;
    iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x8f8));
    if (iVar2 <= col) break;
    pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(in_stack_ffffffffffffefd0,iVar2,col);
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x8f8),(long)local_f34);
    pcVar4 = TPZFMatrix<std::complex<float>_>::operator()(in_stack_ffffffffffffefd0,iVar2,col);
    pcVar4->_M_value = pcVar3->_M_value;
    local_f34 = local_f34 + 1;
  }
  TPZFMatrix<std::complex<float>_>::operator=
            (in_stack_fffffffffffff008,
             &in_stack_fffffffffffff000->super_TPZFMatrix<std::complex<float>_>);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix
            ((TPZFNMatrix<100,_std::complex<float>_> *)0x1ffd187);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix
            ((TPZFNMatrix<100,_std::complex<float>_> *)0x1ffd194);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix
            ((TPZFNMatrix<100,_std::complex<float>_> *)0x1ffd1a1);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix
            ((TPZFNMatrix<100,_std::complex<float>_> *)0x1ffd1ae);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v3(TPZFMatrix<TVar> &v3, const TPZFMatrix<TVar> &r, TPZFMatrix<TVar> &v1Plusv2) const {
	TPZFNMatrix<100,TVar> vec_t(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t2(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t3(fInternalEqs.NElements(),1,0.);
	TPZFNMatrix<100,TVar> inv_sys(fInternalEqs.NElements(),1,0.);
	int i;
	int neqs = fGlobalEqs.NElements();
	//vec_t=R(i)(v1+v2)
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = v1Plusv2(ind.second,0);
	}
	//vec_t2=K(i)*vec_t
	fStiffness->Multiply(vec_t, vec_t2, 0);
	//vec_t=R(i)r
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = r.GetVal(ind.second,0);
	}
	//vec_t3=R(Ii)*(vec_t - vec_t2)
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t3(i,0) = vec_t(fInternalEqs[i],0) - vec_t2(fInternalEqs[i],0);
	}
	//inv_sys = temp_inverted * vec_t3
	fInvertedInternalStiffness.Solve(vec_t3, inv_sys);
	//vec_t=R(Ii)_transposed * inv_sys
	vec_t.Zero();
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t(fInternalEqs[i],0) = inv_sys(i,0);
	}
#ifndef MAKEINTERNAL
	//v3=v3+R(i)_transposed*vec_t
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v3(ind.second,0) += vec_t(ind.first,0);
	}
#else
	v3 = vec_t;
#endif
	
}